

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_handle.cpp
# Opt level: O2

BufferHandle * __thiscall
duckdb::BlockHandle::Load
          (BufferHandle *__return_storage_ptr__,BlockHandle *this,
          unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>
          *reusable_buffer)

{
  MemoryTag MVar1;
  long block_id;
  BlockManager *pBVar2;
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> _Var3;
  BufferManager *pBVar4;
  enable_shared_from_this<duckdb::BlockHandle> *peVar5;
  _Head_base<0UL,_duckdb::Block_*,_false> _Var6;
  type pBVar7;
  _Head_base<0UL,_duckdb::Block_*,_false> local_50;
  FileBuffer *local_48;
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> local_40;
  enable_shared_from_this<duckdb::BlockHandle> local_38;
  enable_shared_from_this<duckdb::BlockHandle> local_28;
  
  if ((this->state)._M_i == BLOCK_LOADED) {
    LOCK();
    (this->readers).super___atomic_base<int>._M_i =
         (this->readers).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    enable_shared_from_this<duckdb::BlockHandle>::shared_from_this(&local_28);
    BufferHandle::BufferHandle
              (__return_storage_ptr__,(shared_ptr<duckdb::BlockHandle,_true> *)&local_28,
               (optional_ptr<duckdb::FileBuffer,_true>)
               (this->buffer).
               super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
               super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>
               .super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl);
    peVar5 = &local_28;
  }
  else {
    block_id = this->block_id;
    if (block_id < 0x4000000000000060) {
      pBVar2 = this->block_manager;
      local_40._M_head_impl =
           (reusable_buffer->
           super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)._M_t.
           super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
           super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl;
      (reusable_buffer->
      super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)._M_t.
      super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
      super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl = (FileBuffer *)0x0;
      AllocateBlock((duckdb *)&local_50,pBVar2,
                    (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *
                    )&local_40,block_id);
      if (local_40._M_head_impl != (FileBuffer *)0x0) {
        (*(local_40._M_head_impl)->_vptr_FileBuffer[1])();
      }
      local_40._M_head_impl = (FileBuffer *)0x0;
      pBVar2 = this->block_manager;
      pBVar7 = unique_ptr<duckdb::Block,_std::default_delete<duckdb::Block>,_true>::operator*
                         ((unique_ptr<duckdb::Block,_std::default_delete<duckdb::Block>,_true> *)
                          &local_50);
      (*pBVar2->_vptr_BlockManager[0xc])(pBVar2,pBVar7);
      _Var6._M_head_impl = local_50._M_head_impl;
      local_50._M_head_impl = (Block *)0x0;
      _Var3._M_head_impl =
           (this->buffer).
           super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
           super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
           super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl;
      (this->buffer).super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>.
      _M_t.super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
      super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl =
           &(_Var6._M_head_impl)->super_FileBuffer;
      if ((_Var3._M_head_impl != (FileBuffer *)0x0) &&
         ((**(code **)((long)(_Var3._M_head_impl)->_vptr_FileBuffer + 8))(),
         local_50._M_head_impl != (Block *)0x0)) {
        (*((local_50._M_head_impl)->super_FileBuffer)._vptr_FileBuffer[1])();
      }
    }
    else {
      if ((this->destroy_buffer_upon)._M_i != BLOCK) {
        BufferHandle::BufferHandle(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      pBVar4 = this->block_manager->buffer_manager;
      MVar1 = this->tag;
      local_48 = (reusable_buffer->
                 super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>).
                 _M_t.
                 super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>
                 .super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl;
      (reusable_buffer->
      super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)._M_t.
      super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
      super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl = (FileBuffer *)0x0;
      (*pBVar4->_vptr_BufferManager[0x25])(&local_50,pBVar4,(ulong)MVar1,this);
      _Var6._M_head_impl = local_50._M_head_impl;
      local_50._M_head_impl = (Block *)0x0;
      _Var3._M_head_impl =
           (this->buffer).
           super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
           super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
           super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl;
      (this->buffer).super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>.
      _M_t.super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
      super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl =
           &(_Var6._M_head_impl)->super_FileBuffer;
      if ((_Var3._M_head_impl != (FileBuffer *)0x0) &&
         ((**(code **)((long)(_Var3._M_head_impl)->_vptr_FileBuffer + 8))(),
         local_50._M_head_impl != (Block *)0x0)) {
        (*((local_50._M_head_impl)->super_FileBuffer)._vptr_FileBuffer[1])();
      }
      local_50._M_head_impl = (Block *)0x0;
      if (local_48 != (FileBuffer *)0x0) {
        (*local_48->_vptr_FileBuffer[1])();
      }
      local_48 = (FileBuffer *)0x0;
    }
    LOCK();
    (this->state)._M_i = BLOCK_LOADED;
    UNLOCK();
    LOCK();
    (this->readers).super___atomic_base<int>._M_i = 1;
    UNLOCK();
    enable_shared_from_this<duckdb::BlockHandle>::shared_from_this(&local_38);
    BufferHandle::BufferHandle
              (__return_storage_ptr__,(shared_ptr<duckdb::BlockHandle,_true> *)&local_38,
               (optional_ptr<duckdb::FileBuffer,_true>)
               (this->buffer).
               super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
               super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>
               .super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl);
    peVar5 = &local_38;
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(peVar5->__weak_this_).internal.
              super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

BufferHandle BlockHandle::Load(unique_ptr<FileBuffer> reusable_buffer) {
	if (state == BlockState::BLOCK_LOADED) {
		// already loaded
		D_ASSERT(buffer);
		++readers;
		return BufferHandle(shared_from_this(), buffer.get());
	}

	if (block_id < MAXIMUM_BLOCK) {
		auto block = AllocateBlock(block_manager, std::move(reusable_buffer), block_id);
		block_manager.Read(*block);
		buffer = std::move(block);
	} else {
		if (MustWriteToTemporaryFile()) {
			buffer = block_manager.buffer_manager.ReadTemporaryBuffer(tag, *this, std::move(reusable_buffer));
		} else {
			return BufferHandle(); // Destroyed upon unpin/evict, so there is no temp buffer to read
		}
	}
	state = BlockState::BLOCK_LOADED;
	readers = 1;
	return BufferHandle(shared_from_this(), buffer.get());
}